

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int addAggInfoColumn(sqlite3 *db,AggInfo *pInfo)

{
  AggInfo_col *pAVar1;
  int local_1c;
  AggInfo *pAStack_18;
  int i;
  AggInfo *pInfo_local;
  sqlite3 *db_local;
  
  pAStack_18 = pInfo;
  pInfo_local = (AggInfo *)db;
  pAVar1 = (AggInfo_col *)sqlite3ArrayAllocate(db,pInfo->aCol,0x20,&pInfo->nColumn,&local_1c);
  pAStack_18->aCol = pAVar1;
  return local_1c;
}

Assistant:

static int addAggInfoColumn(sqlite3 *db, AggInfo *pInfo){
  int i;
  pInfo->aCol = sqlite3ArrayAllocate(
       db,
       pInfo->aCol,
       sizeof(pInfo->aCol[0]),
       &pInfo->nColumn,
       &i
  );
  return i;
}